

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3DLoader.cpp
# Opt level: O0

bool __thiscall
Assimp::Q3DImporter::CanRead(Q3DImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  long lVar2;
  char *pcStack_78;
  char *tokens [2];
  undefined1 local_50 [8];
  string extension;
  bool checkSig_local;
  IOSystem *pIOHandler_local;
  string *pFile_local;
  Q3DImporter *this_local;
  
  extension.field_2._M_local_buf[0xf] = checkSig;
  BaseImporter::GetExtension((string *)local_50,pFile);
  bVar1 = std::operator==((string *)local_50,"q3s");
  if (!bVar1) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50,"q3o");
    if (!bVar1) {
      lVar2 = std::__cxx11::string::length();
      if ((lVar2 == 0) || ((extension.field_2._M_local_buf[0xf] & 1U) != 0)) {
        if (pIOHandler == (IOSystem *)0x0) {
          this_local._7_1_ = true;
        }
        else {
          pcStack_78 = "quick3Do";
          tokens[0] = "quick3Ds";
          this_local._7_1_ =
               BaseImporter::SearchFileHeaderForToken
                         (pIOHandler,pFile,&pcStack_78,2,200,false,false);
        }
      }
      else {
        this_local._7_1_ = false;
      }
      goto LAB_00a47490;
    }
  }
  this_local._7_1_ = true;
LAB_00a47490:
  std::__cxx11::string::~string((string *)local_50);
  return this_local._7_1_;
}

Assistant:

bool Q3DImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const
{
    const std::string extension = GetExtension(pFile);

    if (extension == "q3s" || extension == "q3o")
        return true;
    else if (!extension.length() || checkSig)   {
        if (!pIOHandler)
            return true;
        const char* tokens[] = {"quick3Do","quick3Ds"};
        return SearchFileHeaderForToken(pIOHandler,pFile,tokens,2);
    }
    return false;
}